

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_parse_client_psk_identity(mbedtls_ssl_context *ssl,uchar **p,uchar *end)

{
  int iVar1;
  ulong n_00;
  size_t n;
  int ret;
  uchar *end_local;
  uchar **p_local;
  mbedtls_ssl_context *ssl_local;
  
  n._4_4_ = 0;
  if ((ssl->conf->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) &&
     ((((ssl->conf->psk == (uchar *)0x0 || (ssl->conf->psk_identity == (uchar *)0x0)) ||
       (ssl->conf->psk_identity_len == 0)) || (ssl->conf->psk_len == 0)))) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xbfb,"got no pre-shared key");
    ssl_local._4_4_ = -0x7600;
  }
  else if (end < *p + 2) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
               ,0xc04,"bad client key exchange message");
    ssl_local._4_4_ = -0x7c00;
  }
  else {
    n_00 = (ulong)(int)(uint)CONCAT11(**p,(*p)[1]);
    *p = *p + 2;
    if (((n_00 == 0) || (0xffff < n_00)) || (end < *p + n_00)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                 ,0xc0d,"bad client key exchange message");
      ssl_local._4_4_ = -0x7c00;
    }
    else {
      if (ssl->conf->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) {
        if ((n_00 != ssl->conf->psk_identity_len) ||
           (iVar1 = mbedtls_ssl_safer_memcmp(ssl->conf->psk_identity,*p,n_00), iVar1 != 0)) {
          n._4_4_ = -0x6c80;
        }
      }
      else {
        iVar1 = (*ssl->conf->f_psk)(ssl->conf->p_psk,ssl,*p,n_00);
        if (iVar1 != 0) {
          n._4_4_ = -0x6c80;
        }
      }
      if (n._4_4_ == -0x6c80) {
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_srv.c"
                   ,0xc23,"Unknown PSK identity",*p,n_00);
        ssl_local._4_4_ = mbedtls_ssl_send_alert_message(ssl,'\x02','s');
        if (ssl_local._4_4_ == 0) {
          ssl_local._4_4_ = -0x6c80;
        }
      }
      else {
        *p = *p + n_00;
        ssl_local._4_4_ = 0;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_parse_client_psk_identity( mbedtls_ssl_context *ssl, unsigned char **p,
                                          const unsigned char *end )
{
    int ret = 0;
    size_t n;

    if( ssl->conf->f_psk == NULL &&
        ( ssl->conf->psk == NULL || ssl->conf->psk_identity == NULL ||
          ssl->conf->psk_identity_len == 0 || ssl->conf->psk_len == 0 ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no pre-shared key" ) );
        return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
    }

    /*
     * Receive client pre-shared key identity name
     */
    if( *p + 2 > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    n = ( (*p)[0] << 8 ) | (*p)[1];
    *p += 2;

    if( n < 1 || n > 65535 || *p + n > end )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    if( ssl->conf->f_psk != NULL )
    {
        if( ssl->conf->f_psk( ssl->conf->p_psk, ssl, *p, n ) != 0 )
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
    }
    else
    {
        /* Identity is not a big secret since clients send it in the clear,
         * but treat it carefully anyway, just in case */
        if( n != ssl->conf->psk_identity_len ||
            mbedtls_ssl_safer_memcmp( ssl->conf->psk_identity, *p, n ) != 0 )
        {
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
        }
    }

    if( ret == MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY )
    {
        MBEDTLS_SSL_DEBUG_BUF( 3, "Unknown PSK identity", *p, n );
        if( ( ret = mbedtls_ssl_send_alert_message( ssl,
                              MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                              MBEDTLS_SSL_ALERT_MSG_UNKNOWN_PSK_IDENTITY ) ) != 0 )
        {
            return( ret );
        }

        return( MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY );
    }

    *p += n;

    return( 0 );
}